

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O3

bool __thiscall ON_LocalZero1::FindZero(ON_LocalZero1 *this,double *t)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *sFormat;
  double dVar7;
  double dVar8;
  
  bVar2 = ON_IsValid(this->m_t0);
  bVar3 = ON_IsValid(this->m_t1);
  if (bVar2) {
    dVar1 = this->m_t0;
    dVar8 = dVar1;
    if (bVar3) {
      dVar7 = this->m_t1;
      lVar5 = 0x48;
      lVar6 = 0x38;
      if ((dVar7 < dVar1) && (bVar2 = dVar1 <= dVar7, dVar8 = dVar7, dVar7 = dVar1, bVar2)) {
        sFormat = "Illegal input - m_t0 and m_t1 are not valid.";
        iVar4 = 0x180;
        goto LAB_00560e53;
      }
    }
    else {
      lVar5 = 0x38;
      lVar6 = 0x48;
      dVar7 = dVar1;
    }
  }
  else {
    if (!bVar3) {
      sFormat = "Illegal input - m_t0 and m_t1 are not valid.";
      iVar4 = 0x16b;
      goto LAB_00560e53;
    }
    dVar7 = this->m_t1;
    lVar5 = 0x38;
    lVar6 = 0x48;
    dVar8 = dVar7;
  }
  *(double *)((long)&this->_vptr_ON_LocalZero1 + lVar6) = dVar8;
  *(double *)((long)&this->_vptr_ON_LocalZero1 + lVar5) = dVar7;
  iVar4 = (*this->_vptr_ON_LocalZero1[2])(this,&this->m_f0,0,1);
  if ((dVar8 != dVar7) || (NAN(dVar8) || NAN(dVar7))) {
    if ((char)iVar4 == '\0') {
      sFormat = "Evaluation failed at m_s0.";
      iVar4 = 0x197;
      goto LAB_00560e53;
    }
    iVar4 = (*this->_vptr_ON_LocalZero1[2])(this->m_s1,this,&this->m_f1,0,0xffffffff);
    if ((char)iVar4 == '\0') {
      sFormat = "Evaluation failed at m_s1.";
      iVar4 = 0x19d;
      goto LAB_00560e53;
    }
    bVar2 = BracketZero(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1,0);
    if (!bVar2) {
      sFormat = "Unable to bracket a zero of the function.";
      iVar4 = 0x1a3;
      goto LAB_00560e53;
    }
    dVar8 = ABS(this->m_f0);
    dVar7 = ABS(this->m_f1);
    if ((this->m_f_tolerance < dVar8) || (dVar7 < dVar8)) {
      if (this->m_f_tolerance < dVar7) {
        bVar2 = BracketSpan(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1);
        if (bVar2) {
          bVar2 = NewtonRaphson(this,this->m_s0,this->m_f0,this->m_s1,this->m_f1,0x80,t);
          if (bVar2) {
            return true;
          }
          sFormat = "Newton-Raphson failed to converge.  Is your function C2?";
          iVar4 = 0x1bd;
        }
        else {
          sFormat = "Unable to bracket the function in a span of m_k[].  m_k[] may be invalid.";
          iVar4 = 0x1b7;
        }
        goto LAB_00560e53;
      }
      dVar7 = this->m_s1;
      goto LAB_00560dd5;
    }
  }
  else {
    if ((char)iVar4 == '\0') {
      sFormat = "Evaluation failed.";
      iVar4 = 0x191;
LAB_00560e53:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                 ,iVar4,"",sFormat);
      return false;
    }
    this->m_f1 = this->m_f0;
    if (this->m_f_tolerance < ABS(this->m_f0)) {
      sFormat = "Illegal input - m_t0 = m_t1 and the function value is not zero at m_t0.";
      iVar4 = 0x18e;
      goto LAB_00560e53;
    }
  }
  dVar7 = this->m_s0;
LAB_00560dd5:
  *t = dVar7;
  return true;
}

Assistant:

bool ON_LocalZero1::FindZero( double* t )
{
  // Find values of m_s0 and m_s1 between m_t0 and m_t1 such that
  // f(m_t0) and f(m_t1) have different signs

  if ( !ON_IsValid(m_t0) )
  {
    if ( !ON_IsValid(m_t1) )
    {
      ON_ERROR("Illegal input - m_t0 and m_t1 are not valid.");
      return false;
    }
    m_s0 = m_s1 = m_t1;
  }
  else if ( !ON_IsValid(m_t1) )
  {
    m_s0 = m_s1 = m_t0;
  }
  else if ( m_t0 <= m_t1 )
  {
    m_s0 = m_t0;
    m_s1 = m_t1;
  }
  else if ( m_t1 < m_t0 )
  {
    m_s0 = m_t1;
    m_s1 = m_t0;
  }
  else
  {
    ON_ERROR("Illegal input - m_t0 and m_t1 are not valid.");
    return false;
  }

  if ( m_s0 == m_s1 )
  {
    if ( Evaluate( m_s0, &m_f0, nullptr, 1 ) ) 
    {
      m_f1 = m_f0;
      if ( fabs(m_f0) <= m_f_tolerance ) 
      {
        *t = m_s0;
        return true;
      }
      ON_ERROR("Illegal input - m_t0 = m_t1 and the function value is not zero at m_t0.");
      return false;
    }
    ON_ERROR("Evaluation failed.");
    return false;
  }

  if ( !Evaluate( m_s0, &m_f0, nullptr, 1 ) )
  {
    ON_ERROR("Evaluation failed at m_s0.");
    return false;
  }

  if ( !Evaluate( m_s1, &m_f1, nullptr, -1 ) )
  {
    ON_ERROR("Evaluation failed at m_s1.");
    return false;
  }

  if ( !BracketZero( m_s0, m_f0, m_s1, m_f1 ) )
  {
    ON_ERROR("Unable to bracket a zero of the function.");
    return false;
  }

  if ( fabs(m_f0) <= m_f_tolerance && fabs(m_f0) <= fabs(m_f1) )
  {
    // |f(s0)| <= user specified stopping tolerance
    *t = m_s0;
    return true;
  }
  
  if ( fabs(m_f1) <= m_f_tolerance ) 
  {
    // |f(s1)| <= user specified stopping tolerance
    *t = m_s1;
    return true;
  }

  if ( !BracketSpan( m_s0, m_f0, m_s1, m_f1 ) )
  {
    ON_ERROR("Unable to bracket the function in a span of m_k[].  m_k[] may be invalid.");
    return false;
  }

  if ( !NewtonRaphson( m_s0, m_f0, m_s1, m_f1, 128, t ) )
  {
    ON_ERROR("Newton-Raphson failed to converge.  Is your function C2?");
    return false;
  }

  return true;
}